

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_p.h
# Opt level: O0

uint64_t load_64_bits(uchar *in,uint bits)

{
  uint64_t uVar1;
  byte in_SIL;
  void *in_RDI;
  uint64_t chunk;
  
  uVar1 = zng_memread_8(in_RDI);
  return uVar1 << (in_SIL & 0x3f);
}

Assistant:

static inline uint64_t load_64_bits(const unsigned char *in, unsigned bits) {
    uint64_t chunk = zng_memread_8(in);

#if BYTE_ORDER == LITTLE_ENDIAN
    return chunk << bits;
#else
    return ZSWAP64(chunk) << bits;
#endif
}